

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_DumpLibrary(Dtt_Man_t *p,char *FileName)

{
  Vec_Int_t *pVVar1;
  undefined4 NPout;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint tNpn;
  uint tNpn_00;
  uint uVar6;
  Vec_Int_t *p_00;
  int *__dest;
  Vec_Vec_t *p_01;
  void **ppvVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  uint *pType;
  void *pvVar10;
  FILE *__stream;
  Dtt_FunImpl_t *pFun;
  ulong uVar11;
  int *__src;
  long lVar12;
  size_t sVar13;
  Vec_Vec_t *pVVar14;
  int iVar15;
  ulong local_d0;
  uint local_a0;
  char str [100];
  
  pVVar1 = p->vTruthNpns;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = pVVar1->nSize;
  local_d0 = (ulong)iVar5;
  p_00->nSize = iVar5;
  p_00->nCap = iVar5;
  if (local_d0 == 0) {
    sVar13 = 0;
    __dest = (int *)0x0;
  }
  else {
    sVar13 = local_d0 * 4;
    __dest = (int *)malloc(sVar13);
  }
  p_00->pArray = __dest;
  __src = pVVar1->pArray;
  memcpy(__dest,__src,sVar13);
  if (1 < iVar5) {
    Vec_IntSort(p_00,(int)__src);
    uVar2 = 1;
    for (uVar11 = 1; local_d0 != uVar11; uVar11 = uVar11 + 1) {
      if (__dest[uVar11] != __dest[uVar11 - 1]) {
        lVar12 = (long)(int)uVar2;
        uVar2 = uVar2 + 1;
        __dest[lVar12] = __dest[uVar11];
      }
    }
    p_00->nSize = uVar2;
    local_d0 = (ulong)uVar2;
  }
  sVar13 = 0x10;
  p_01 = (Vec_Vec_t *)malloc(0x10);
  iVar5 = (int)local_d0;
  iVar15 = 8;
  if (6 < iVar5 - 1U) {
    iVar15 = iVar5;
  }
  p_01->nCap = iVar15;
  uVar11 = 0;
  if (iVar15 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    sVar13 = (long)iVar15 << 3;
    ppvVar7 = (void **)malloc(sVar13);
  }
  p_01->pArray = ppvVar7;
  uVar8 = 0;
  if (0 < iVar5) {
    uVar8 = local_d0 & 0xffffffff;
  }
  for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
    pVVar9 = Vec_PtrAlloc((int)sVar13);
    ppvVar7[uVar11] = pVVar9;
  }
  p_01->nSize = iVar5;
  uVar2 = 0;
  do {
    if (p->vTruths->nSize <= (int)uVar2) {
      __stream = fopen(FileName,"wb");
      for (uVar2 = 0; local_a0 = (uint)uVar8, uVar2 != local_a0; uVar2 = uVar2 + 1) {
        uVar3 = Vec_IntEntry(p_00,uVar2);
        if (1 < uVar2) {
          for (iVar5 = 0; pVVar9 = Vec_VecEntry(p_01,uVar2), iVar5 < pVVar9->nSize;
              iVar5 = iVar5 + 1) {
            pVVar9 = Vec_VecEntry(p_01,uVar2);
            pFun = (Dtt_FunImpl_t *)Vec_PtrEntry(pVVar9,iVar5);
            str._0_4_ = str._0_4_ & 0xffffff00;
            Dtt_MakeFormula(uVar3,pFun,p_01,0x43210,str,1,(FILE *)__stream);
          }
        }
      }
      fclose(__stream);
      printf("Dumped file \"%s\". \n",FileName);
      fflush(_stdout);
      return;
    }
    uVar3 = Vec_IntEntry(p->vTruths,uVar2);
    if (1 < uVar2) {
      pType = (uint *)calloc(1,0x14);
      uVar4 = Vec_IntEntry(p->vConfigs,uVar2);
      *pType = uVar4 & 7;
      pVVar1 = p->vTruths;
      iVar15 = uVar2 * 2 + 1;
      iVar5 = Vec_IntEntry(p->vFanins,iVar15);
      uVar4 = Vec_IntEntry(pVVar1,iVar5);
      pVVar1 = p->vTruthNpns;
      iVar5 = Vec_IntEntry(p->vFanins,uVar2 * 2);
      tNpn = Vec_IntEntry(pVVar1,iVar5);
      pVVar1 = p->vTruthNpns;
      iVar5 = Vec_IntEntry(p->vFanins,iVar15);
      tNpn_00 = Vec_IntEntry(pVVar1,iVar5);
      uVar6 = Vec_IntFind(p_00,tNpn);
      pType[2] = uVar6;
      uVar6 = Vec_IntFind(p_00,tNpn_00);
      pType[4] = uVar6;
      iVar5 = 0;
      while( true ) {
        iVar15 = Vec_IntEntry(p->vTruthNpns,uVar2);
        iVar15 = Vec_IntFind(p_00,iVar15);
        pVVar9 = Vec_VecEntry(p_01,iVar15);
        iVar15 = pVVar9->nSize;
        uVar6 = Vec_IntEntry(p->vTruthNpns,uVar2);
        if (iVar15 <= iVar5) break;
        iVar15 = Vec_IntFind(p_00,uVar6);
        pVVar9 = Vec_VecEntry(p_01,iVar15);
        pvVar10 = Vec_PtrEntry(pVVar9,iVar5);
        if (((*(uint *)((long)pvVar10 + 8) == pType[2]) &&
            (*(uint *)((long)pvVar10 + 0x10) == pType[4])) ||
           ((*(uint *)((long)pvVar10 + 0x10) == pType[2] &&
            (*(uint *)((long)pvVar10 + 8) == pType[4])))) {
          free(pType);
          goto LAB_0043edb6;
        }
        iVar5 = iVar5 + 1;
      }
      Dtt_FindNP(p,uVar6,0,uVar3,(int *)str,(int *)pType,0);
      NPout = str._0_4_;
      Dtt_FindNP(p,uVar4,uVar3,tNpn,(int *)(pType + 1),(int *)pType,str._0_4_);
      Dtt_FindNP(p,uVar4,0,tNpn_00,(int *)(pType + 3),(int *)pType,NPout);
      iVar5 = Vec_IntEntry(p->vTruthNpns,uVar2);
      iVar5 = Vec_IntFind(p_00,iVar5);
      if ((int)local_d0 <= iVar5) {
        uVar3 = iVar5 + 1;
        local_d0 = (ulong)uVar3;
        pVVar14 = p_01;
        Vec_PtrGrow((Vec_Ptr_t *)p_01,uVar3);
        for (lVar12 = (long)p_01->nSize; lVar12 <= iVar5; lVar12 = lVar12 + 1) {
          pVVar9 = Vec_PtrAlloc((int)pVVar14);
          p_01->pArray[lVar12] = pVVar9;
        }
        p_01->nSize = uVar3;
      }
      pVVar9 = Vec_VecEntry(p_01,iVar5);
      iVar5 = pVVar9->nSize;
      if (iVar5 == pVVar9->nCap) {
        iVar15 = iVar5 * 2;
        if (iVar5 < 0x10) {
          iVar15 = 0x10;
        }
        Vec_PtrGrow(pVVar9,iVar15);
        iVar5 = pVVar9->nSize;
      }
      pVVar9->nSize = iVar5 + 1;
      pVVar9->pArray[iVar5] = pType;
    }
LAB_0043edb6:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void Dtt_DumpLibrary( Dtt_Man_t * p, char* FileName )
{
    FILE * pFile;
    char str[100], sFI1[50], sFI2[50];
    int i, j, Entry, fRepeat;
    Dtt_FunImpl_t * pFun, * pFun2;
    Vec_Int_t * vLibFun = Vec_IntDup( p->vTruthNpns );  // none-duplicating vector of NPN representitives
    Vec_Vec_t * vLibImpl;
    Vec_IntUniqify( vLibFun );
    vLibImpl = Vec_VecStart( Vec_IntSize( vLibFun ) );
    Vec_IntForEachEntry( p->vTruths, Entry, i )
    {
        int NP, Fanin2, Fanin1Npn, Fanin2Npn;
        if (i<2) continue; // skip const 0
        pFun = ABC_CALLOC( Dtt_FunImpl_t, 1 );
        pFun->Type = (int)( 0x7 & Vec_IntEntry(p->vConfigs, i) );
        //word Fanin1 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2 = Vec_IntEntry( p->vTruths, Vec_IntEntry( p->vFanins, i*2+1 ) );
        Fanin1Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2 ) );
        Fanin2Npn = Vec_IntEntry( p->vTruthNpns, Vec_IntEntry( p->vFanins, i*2+1 ) );
        pFun->FI1 = Vec_IntFind( vLibFun, Fanin1Npn );
        pFun->FI2 = Vec_IntFind( vLibFun, Fanin2Npn );
        
        fRepeat = 0;
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun2, j, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ) )
        {
            if ( ( pFun2->FI1 == pFun->FI1 && pFun2->FI2 == pFun->FI2 ) || ( pFun2->FI2 == pFun->FI1 && pFun2->FI1 == pFun->FI2 ) )
            {
                fRepeat = 1;
                break;
            }
        }
        if (fRepeat) 
        {
            ABC_FREE( pFun );
            continue;
        }

        Dtt_FindNP( p, Vec_IntEntry( p->vTruthNpns, i ), 0, Entry, &NP, &(pFun->Type), 0 ); //out: tGoal=0, NPout=0
        Dtt_FindNP( p, Fanin2, Entry, Fanin1Npn, &(pFun->NP1), &(pFun->Type), NP ); //FI1
        Dtt_FindNP( p, Fanin2, 0, Fanin2Npn, &(pFun->NP2), &(pFun->Type), NP ); //FI2: tGoal=0
        
        Vec_VecPush( vLibImpl, Vec_IntFind( vLibFun, Vec_IntEntry( p->vTruthNpns, i ) ), pFun );
    }

    // print to file
    pFile = fopen( FileName, "wb" );

    if (0)
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if (!Entry) continue; // skip const 0
        fprintf( pFile, "%08x: ", (unsigned)Entry );
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            Dtt_FunImplFI2Str( pFun->FI1, pFun->NP1, vLibFun, sFI1 ); 
            Dtt_FunImplFI2Str( pFun->FI2, pFun->NP2, vLibFun, sFI2 );
            Dtt_FunImpl2Str( pFun->Type, sFI1, sFI2, str );
            fprintf( pFile, "%s, ", str );
        }
        fprintf( pFile, "\n" );
    }

    // formula format
    Vec_IntForEachEntry( vLibFun, Entry, i )
    {
        if ( i<2 ) continue; // skip const 0 and buffer
        Vec_VecForEachEntryLevel( Dtt_FunImpl_t*, vLibImpl, pFun, j, i )
        {
            str[0] = 0; //sprintf( str, "" );
            Dtt_MakeFormula( (unsigned)Entry, pFun, vLibImpl, (4<<16)+(3<<12)+(2<<8)+(1<<4), str, 1, pFile );
        }
    }

    fclose( pFile );
    printf( "Dumped file \"%s\". \n", FileName );
    fflush( stdout );
}